

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmsgs.cc
# Opt level: O0

int beMsgGetListBdIds(be_node *n,list<bdId,_std::allocator<bdId>_> *nodes)

{
  int iVar1;
  longlong lVar2;
  undefined1 local_50 [8];
  bdId id;
  int i;
  int count;
  int len;
  list<bdId,_std::allocator<bdId>_> *nodes_local;
  be_node *n_local;
  
  if (n->type == BE_STR) {
    lVar2 = be_str_len(n);
    id.id.data._16_4_ = (int)lVar2 / 0x1a;
    id.id.data[0xc] = '\0';
    id.id.data[0xd] = '\0';
    id.id.data[0xe] = '\0';
    id.id.data[0xf] = '\0';
    for (; (int)id.id.data._12_4_ < (int)id.id.data._16_4_;
        id.id.data._12_4_ = id.id.data._12_4_ + 1) {
      bdId::bdId((bdId *)local_50);
      iVar1 = decodeCompactNodeId((bdId *)local_50,(n->val).s + id.id.data._12_4_ * 0x1a,0x1a);
      if (iVar1 != 0) {
        std::__cxx11::list<bdId,_std::allocator<bdId>_>::push_back(nodes,(value_type *)local_50);
      }
    }
    n_local._4_4_ = 1;
  }
  else {
    n_local._4_4_ = 0;
  }
  return n_local._4_4_;
}

Assistant:

int beMsgGetListBdIds(be_node *n, std::list<bdId> &nodes) {
	/* extract the string pointer, and size */
	/* split into parts */

        if (n->type != BE_STR)
            return 0;

	int len = be_str_len(n);
	int count = len / BITDHT_COMPACTNODEID_LEN;
	for (int i = 0; i < count; i++) {
		bdId id;
		if (decodeCompactNodeId(&id, &(n->val.s[i*BITDHT_COMPACTNODEID_LEN]), BITDHT_COMPACTNODEID_LEN))
			nodes.push_back(id);
	}
    return 1;
}